

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O3

uint32_t __thiscall
ans_fold_decode<8U>::decode_sym(ans_fold_decode<8U> *this,uint64_t *state,uint8_t **in_u8)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  
  pdVar5 = (this->table).super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = this->frame_mask & *state;
  uVar8 = (ulong)pdVar5[uVar6].offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar5[uVar6].freq;
  *state = uVar8;
  puVar7 = *in_u8;
  if (uVar8 < this->lower_bound) {
    puVar1 = (uint *)(puVar7 + -4);
    puVar7 = puVar7 + -4;
    *state = (ulong)*puVar1 | uVar8 << 0x20;
  }
  uVar2 = pdVar5[uVar6].mapped_num;
  uVar6 = (ulong)(uVar2 >> 0x1e);
  uVar3 = ans_fold_undo_mapping::except_mask._M_elems[uVar6];
  uVar4 = *(uint *)(puVar7 + -uVar6);
  *in_u8 = puVar7 + -uVar6;
  return (uVar3 & uVar4) + (uVar2 & 0x3fffffff);
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_fold_undo_mapping(entry, in_u8);
        return decoded_sym;
    }